

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  TargetType tgtType;
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  cmMessenger *messenger;
  ostream *poVar7;
  size_t sVar8;
  char *__s;
  pointer pcVar9;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  tgtType = this->TargetTypeValue;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
  bVar5 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)local_1a8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a8);
  if (!bVar5) {
    return;
  }
  iVar6 = std::__cxx11::string::compare((char *)prop);
  if (iVar6 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n",0x32);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"NAME property is read-only\n",0x1b);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)prop);
      if (iVar6 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"TYPE property is read-only\n",0x1b);
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)prop);
        if ((iVar6 == 0) && (this->IsImportedTarget == true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "EXPORT_NAME property can\'t be set on imported targets (\"",0x38);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                              (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
          pcVar1 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)prop);
          if ((iVar6 != 0) || (this->IsImportedTarget != true)) {
            iVar6 = std::__cxx11::string::compare((char *)prop);
            if (iVar6 == 0) {
              pcVar2 = (this->Internal).Pointer;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_erase_at_end(&pcVar2->IncludeDirectoriesEntries,
                                (pcVar2->IncludeDirectoriesEntries).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              pcVar2 = (this->Internal).Pointer;
              pcVar3 = (pcVar2->IncludeDirectoriesBacktraces).
                       super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar4 = (pcVar2->IncludeDirectoriesBacktraces).
                       super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pcVar9 = pcVar3;
              if (pcVar4 != pcVar3) {
                do {
                  cmListFileBacktrace::~cmListFileBacktrace(pcVar9);
                  pcVar9 = pcVar9 + 1;
                } while (pcVar9 != pcVar4);
                (pcVar2->IncludeDirectoriesBacktraces).
                super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                _M_impl.super__Vector_impl_data._M_finish = pcVar3;
              }
              if (value == (char *)0x0) {
                return;
              }
              pcVar2 = (this->Internal).Pointer;
              local_1a8._0_8_ = (cmState *)local_198;
              sVar8 = strlen(value);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,value,value + sVar8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1a8);
              if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
                operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
              }
              cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,
                         (cmListFileBacktrace *)local_1a8);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)prop);
              if (iVar6 == 0) {
                pcVar2 = (this->Internal).Pointer;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase_at_end(&pcVar2->CompileOptionsEntries,
                                  (pcVar2->CompileOptionsEntries).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                pcVar2 = (this->Internal).Pointer;
                pcVar3 = (pcVar2->CompileOptionsBacktraces).
                         super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pcVar4 = (pcVar2->CompileOptionsBacktraces).
                         super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pcVar9 = pcVar3;
                if (pcVar4 != pcVar3) {
                  do {
                    cmListFileBacktrace::~cmListFileBacktrace(pcVar9);
                    pcVar9 = pcVar9 + 1;
                  } while (pcVar9 != pcVar4);
                  (pcVar2->CompileOptionsBacktraces).
                  super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                  _M_impl.super__Vector_impl_data._M_finish = pcVar3;
                }
                if (value == (char *)0x0) {
                  return;
                }
                pcVar2 = (this->Internal).Pointer;
                local_1a8._0_8_ = (cmState *)local_198;
                sVar8 = strlen(value);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,value,value + sVar8);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar2->CompileOptionsEntries,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
                if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
                  operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
                }
                cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->CompileOptionsBacktraces,
                           (cmListFileBacktrace *)local_1a8);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)prop);
                if (iVar6 == 0) {
                  pcVar2 = (this->Internal).Pointer;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase_at_end(&pcVar2->CompileFeaturesEntries,
                                    (pcVar2->CompileFeaturesEntries).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  pcVar2 = (this->Internal).Pointer;
                  pcVar3 = (pcVar2->CompileFeaturesBacktraces).
                           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pcVar4 = (pcVar2->CompileFeaturesBacktraces).
                           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pcVar9 = pcVar3;
                  if (pcVar4 != pcVar3) {
                    do {
                      cmListFileBacktrace::~cmListFileBacktrace(pcVar9);
                      pcVar9 = pcVar9 + 1;
                    } while (pcVar9 != pcVar4);
                    (pcVar2->CompileFeaturesBacktraces).
                    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                    _M_impl.super__Vector_impl_data._M_finish = pcVar3;
                  }
                  if (value == (char *)0x0) {
                    return;
                  }
                  pcVar2 = (this->Internal).Pointer;
                  local_1a8._0_8_ = (cmState *)local_198;
                  sVar8 = strlen(value);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,value,value + sVar8);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pcVar2->CompileFeaturesEntries,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8);
                  if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
                    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
                  }
                  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->Internal).Pointer)->CompileFeaturesBacktraces,
                             (cmListFileBacktrace *)local_1a8);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)prop);
                  if (iVar6 == 0) {
                    pcVar2 = (this->Internal).Pointer;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::_M_erase_at_end(&pcVar2->CompileDefinitionsEntries,
                                      (pcVar2->CompileDefinitionsEntries).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    pcVar2 = (this->Internal).Pointer;
                    pcVar3 = (pcVar2->CompileDefinitionsBacktraces).
                             super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pcVar4 = (pcVar2->CompileDefinitionsBacktraces).
                             super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    pcVar9 = pcVar3;
                    if (pcVar4 != pcVar3) {
                      do {
                        cmListFileBacktrace::~cmListFileBacktrace(pcVar9);
                        pcVar9 = pcVar9 + 1;
                      } while (pcVar9 != pcVar4);
                      (pcVar2->CompileDefinitionsBacktraces).
                      super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                      _M_impl.super__Vector_impl_data._M_finish = pcVar3;
                    }
                    if (value == (char *)0x0) {
                      return;
                    }
                    pcVar2 = (this->Internal).Pointer;
                    local_1a8._0_8_ = (cmState *)local_198;
                    sVar8 = strlen(value);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1a8,value,value + sVar8);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &pcVar2->CompileDefinitionsEntries,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a8);
                    if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
                      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
                    }
                    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->Internal).Pointer)->CompileDefinitionsBacktraces,
                              (cmListFileBacktrace *)local_1a8);
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)prop);
                    if (iVar6 == 0) {
                      pcVar2 = (this->Internal).Pointer;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::_M_erase_at_end(&pcVar2->LinkImplementationPropertyEntries,
                                        (pcVar2->LinkImplementationPropertyEntries).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      pcVar2 = (this->Internal).Pointer;
                      pcVar3 = (pcVar2->LinkImplementationPropertyBacktraces).
                               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      pcVar4 = (pcVar2->LinkImplementationPropertyBacktraces).
                               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      pcVar9 = pcVar3;
                      if (pcVar4 != pcVar3) {
                        do {
                          cmListFileBacktrace::~cmListFileBacktrace(pcVar9);
                          pcVar9 = pcVar9 + 1;
                        } while (pcVar9 != pcVar4);
                        (pcVar2->LinkImplementationPropertyBacktraces).
                        super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                        ._M_impl.super__Vector_impl_data._M_finish = pcVar3;
                      }
                      if (value == (char *)0x0) {
                        return;
                      }
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
                      pcVar2 = (this->Internal).Pointer;
                      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                      sVar8 = strlen(value);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1c8,value,value + sVar8);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pcVar2->LinkImplementationPropertyEntries,&local_1c8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                        operator_delete(local_1c8._M_dataplus._M_p,
                                        local_1c8.field_2._M_allocated_capacity + 1);
                      }
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces,
                                (value_type *)local_1a8);
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)prop);
                      if (iVar6 != 0) {
                        iVar6 = strncmp((prop->_M_dataplus)._M_p,"IMPORTED_LIBNAME",0x10);
                        if (iVar6 == 0) {
                          __s = "";
                          if (value != (char *)0x0) {
                            __s = value;
                          }
                          local_1a8._0_8_ = (cmState *)local_198;
                          sVar8 = strlen(__s);
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1a8,__s,__s + sVar8);
                          bVar5 = CheckImportedLibName(this,prop,(string *)local_1a8);
                          if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
                            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
                          }
                          if (!bVar5) {
                            return;
                          }
                        }
                        iVar6 = std::__cxx11::string::compare((char *)prop);
                        if ((iVar6 != 0) || (this->TargetTypeValue == OBJECT_LIBRARY)) {
                          cmPropertyMap::SetProperty(&this->Properties,prop,value);
                          return;
                        }
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,
                                   "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                   ,0x46);
                        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                                            (this->Name)._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
                        pcVar1 = this->Makefile;
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
                        goto LAB_0039844f;
                      }
                      pcVar2 = (this->Internal).Pointer;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::_M_erase_at_end(&pcVar2->SourceEntries,
                                        (pcVar2->SourceEntries).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      pcVar2 = (this->Internal).Pointer;
                      pcVar3 = (pcVar2->SourceBacktraces).
                               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      pcVar4 = (pcVar2->SourceBacktraces).
                               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      pcVar9 = pcVar3;
                      if (pcVar4 != pcVar3) {
                        do {
                          cmListFileBacktrace::~cmListFileBacktrace(pcVar9);
                          pcVar9 = pcVar9 + 1;
                        } while (pcVar9 != pcVar4);
                        (pcVar2->SourceBacktraces).
                        super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                        ._M_impl.super__Vector_impl_data._M_finish = pcVar3;
                      }
                      if (value == (char *)0x0) {
                        return;
                      }
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
                      pcVar2 = (this->Internal).Pointer;
                      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                      sVar8 = strlen(value);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1c8,value,value + sVar8);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pcVar2->SourceEntries,&local_1c8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                        operator_delete(local_1c8._M_dataplus._M_p,
                                        local_1c8.field_2._M_allocated_capacity + 1);
                      }
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->Internal).Pointer)->SourceBacktraces,
                                (value_type *)local_1a8);
                    }
                  }
                }
              }
            }
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a8);
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"SOURCES property can\'t be set on imported targets (\"",
                     0x34);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                              (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
          pcVar1 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
        }
      }
    }
  }
LAB_0039844f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "MANUALLY_ADDED_DEPENDENCIES") {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "TYPE") {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  if (prop == "INCLUDE_DIRECTORIES") {
    this->Internal->IncludeDirectoriesEntries.clear();
    this->Internal->IncludeDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    this->Internal->CompileOptionsEntries.clear();
    this->Internal->CompileOptionsBacktraces.clear();
    if (value) {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    this->Internal->CompileFeaturesEntries.clear();
    this->Internal->CompileFeaturesBacktraces.clear();
    if (value) {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    this->Internal->CompileDefinitionsEntries.clear();
    this->Internal->CompileDefinitionsBacktraces.clear();
    if (value) {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    this->Internal->LinkImplementationPropertyEntries.clear();
    this->Internal->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    this->Internal->SourceEntries.clear();
    this->Internal->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->SourceEntries.push_back(value);
      this->Internal->SourceBacktraces.push_back(lfbt);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == "CUDA_PTX_COMPILATION" &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  } else {
    this->Properties.SetProperty(prop, value);
  }
}